

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_decode_from_hex_Test::TestBody
          (HexEncoderTest_test_decode_from_hex_Test *this)

{
  reference pvVar1;
  char *pcVar2;
  allocator<char> local_f9;
  AssertHelper local_f8;
  AssertionResult gtest_ar;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  
  local_f8.data_._0_1_ = 0x23;
  std::__cxx11::string::string<std::allocator<char>>(local_28,"23",&local_f9);
  bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_e0);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,0);
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&gtest_ar,"(unsigned char) 35","HexEncoder::DecodeFromHex(\"23\").at(0)",
             (uchar *)&local_f8,pvVar1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
  std::__cxx11::string::~string(local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_f8.data_._0_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>(local_48,"00",&local_f9);
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_e0);
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,0);
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)&gtest_ar,"(unsigned char) 0","HexEncoder::DecodeFromHex(\"00\").at(0)",
               (uchar *)&local_f8,pvVar1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
    std::__cxx11::string::~string(local_48);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x2e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_f8.data_._0_1_ = 0x56;
      std::__cxx11::string::string<std::allocator<char>>(local_68,"56",&local_f9);
      bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_e0);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,0);
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)&gtest_ar,"(unsigned char) 86",
                 "HexEncoder::DecodeFromHex(\"56\").at(0)",(uchar *)&local_f8,pvVar1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
      std::__cxx11::string::~string(local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_e0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x2f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_f8.data_._0_1_ = 0x69;
        std::__cxx11::string::string<std::allocator<char>>(local_88,"69",&local_f9);
        bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_e0);
        pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,0);
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  ((internal *)&gtest_ar,"(unsigned char) 105",
                   "HexEncoder::DecodeFromHex(\"69\").at(0)",(uchar *)&local_f8,pvVar1);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
        std::__cxx11::string::~string(local_88);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_e0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x30,pcVar2);
          testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_f8.data_._0_1_ = 0x5b;
          std::__cxx11::string::string<std::allocator<char>>(local_a8,"5B",&local_f9);
          bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_e0);
          pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,0);
          testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                    ((internal *)&gtest_ar,"(unsigned char) 91",
                     "HexEncoder::DecodeFromHex(\"5B\").at(0)",(uchar *)&local_f8,pvVar1);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0)
          ;
          std::__cxx11::string::~string(local_a8);
          if (gtest_ar.success_ != false) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_f8.data_._0_1_ = 0x79;
            std::__cxx11::string::string<std::allocator<char>>(local_c8,"79",&local_f9);
            bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_e0);
            pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,0
                               );
            testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                      ((internal *)&gtest_ar,"(unsigned char) 121",
                       "HexEncoder::DecodeFromHex(\"79\").at(0)",(uchar *)&local_f8,pvVar1);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_e0);
            std::__cxx11::string::~string(local_c8);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_e0);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                         ,0x32,pcVar2);
              testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
              testing::internal::AssertHelper::~AssertHelper(&local_f8);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_e0);
            }
            goto LAB_001832d2;
          }
          testing::Message::Message((Message *)&local_e0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x31,pcVar2);
          testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_f8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_e0);
LAB_001832d2:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HexEncoderTest, test_decode_from_hex)
{
    ASSERT_EQ((unsigned char) 35, HexEncoder::DecodeFromHex("23").at(0));
    ASSERT_EQ((unsigned char) 0, HexEncoder::DecodeFromHex("00").at(0));
    ASSERT_EQ((unsigned char) 86, HexEncoder::DecodeFromHex("56").at(0));
    ASSERT_EQ((unsigned char) 105, HexEncoder::DecodeFromHex("69").at(0));
    ASSERT_EQ((unsigned char) 91, HexEncoder::DecodeFromHex("5B").at(0));
    ASSERT_EQ((unsigned char) 121, HexEncoder::DecodeFromHex("79").at(0));
}